

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O0

void HN::parseJob(ItemData *data,Job *res)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  longlong lVar4;
  mapped_type *pmVar5;
  reference pcVar6;
  string *in_RSI;
  key_type *in_RDI;
  char *ch;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  int slash;
  string *in_stack_00000308;
  size_t *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffdf0;
  key_type *pkVar7;
  key_type *in_stack_fffffffffffffe08;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  allocator<char> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  key_type *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  string *local_158;
  int local_150;
  allocator<char> local_149;
  string local_148 [39];
  undefined1 local_121 [33];
  string local_100 [32];
  string local_e0 [39];
  undefined1 local_b9 [40];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  string *local_10;
  key_type *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::__cxx11::string::operator=(local_10,(string *)pmVar3);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,0);
  *(int *)(local_10 + 0x20) = iVar2;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,0);
  *(int *)(local_10 + 0x24) = iVar2;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b9;
  __s = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffe20);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  lVar4 = std::__cxx11::stoll(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,0);
  *(longlong *)(local_10 + 0x28) = lVar4;
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  this = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_121;
  pkVar7 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)pmVar3);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(this,pkVar7);
  std::__cxx11::string::string(local_100,(string *)pmVar5);
  parseHTML(in_stack_00000308);
  std::__cxx11::string::operator=(local_10 + 0x30,local_e0);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string((string *)(local_121 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)pmVar3);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(this,pkVar7);
  std::__cxx11::string::operator=(local_10 + 0x50,(string *)pmVar3);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::operator=(local_10 + 0x70,"");
  local_150 = 0;
  local_158 = local_10 + 0x50;
  local_160._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  pkVar7 = local_8;
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)pkVar7,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)pmVar3);
    if (!bVar1) {
      return;
    }
    pcVar6 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_160);
    if (*pcVar6 == '/') {
      local_150 = local_150 + 1;
    }
    else {
      if (2 < local_150) {
        return;
      }
      if (1 < local_150) {
        std::__cxx11::string::operator+=(local_10 + 0x70,*pcVar6);
      }
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_160);
  } while( true );
}

Assistant:

void parseJob(const ItemData & data, Job & res) {
        try {
            res.by = data.at("by");
        } catch (...) {
            res.by = "[deleted]";
        }
        try {
            res.id = std::stoi(data.at("id"));
        } catch (...) {
            res.id = 0;
        }
        try {
            res.score = std::stoi(data.at("score"));
        } catch (...) {
            res.score = 0;
        }
        try {
            res.time = std::stoll(data.at("time"));
        } catch (...) {
            res.time = 0;
        }
        try {
            res.title = parseHTML(data.at("title"));
        } catch (...) {
            res.title = "";
        }
        try {
            res.url = data.at("url");
            res.domain = "";
            int slash = 0;
            for (auto & ch : res.url) {
                if (ch == '/') {
                    ++slash;
                    continue;
                }
                if (slash > 2) break;
                if (slash > 1) res.domain += ch;
            }
        } catch (...) {
            res.url = "";
            res.domain = "";
        }
    }